

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::DeleteProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,PropertyOperationFlags propertyOperationFlags)

{
  Type *pTVar1;
  byte bVar2;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar3;
  RecyclableObject *value;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  unsigned_short uVar7;
  charcount_t cVar8;
  PropertyId propertyId;
  char16 *pcVar9;
  undefined4 *puVar10;
  undefined1 local_70 [8];
  CharacterBuffer<char16_t> propertyName;
  DictionaryPropertyDescriptor<unsigned_short> *local_38;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  pcVar9 = JavascriptString::GetString(propertyNameString);
  cVar8 = JavascriptString::GetLength(propertyNameString);
  bVar5 = PropertyRecord::IsPropertyNameNumeric(pcVar9,cVar8);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x3a3,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* "
                               );
    if (!bVar5) goto LAB_00c23897;
    *puVar10 = 0;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  pJVar3 = (this_00->super_ScriptContextBase).javascriptLibrary;
  pcVar9 = JavascriptString::GetString(propertyNameString);
  cVar8 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
            ((WriteBarrierPtr<const_char16_t> *)local_70,pcVar9);
  propertyName.string.ptr._0_4_ = cVar8;
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(CharacterBuffer<char16_t> *)local_70,&local_38);
  if (bVar5) {
    bVar5 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler);
    if (((!bVar5) &&
        (bVar5 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString), bVar5)
        ) && (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
             ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
                ((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                 &propertyName.len,&pJVar3->typesWithNoSpecialPropertyProtoChain);
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyName._8_8_);
    }
    bVar5 = DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits(local_38);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x3b7,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar5) goto LAB_00c23897;
      *puVar10 = 0;
    }
    bVar2 = local_38->Attributes;
    if ((bVar2 & 8) != 0) {
      return 1;
    }
    if ((bVar2 & 2) == 0) {
      pcVar9 = JavascriptString::GetString(propertyNameString);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                (propertyOperationFlags,this_00,pcVar9);
      return 0;
    }
    value = (pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
    if (((bVar2 & 0x10) != 0) && ((local_38->flags & IsShadowed) == None)) {
      return 0;
    }
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(local_38);
    if (uVar6 == 0xffff) {
      if ((local_38->flags & IsAccessor) == None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x3d1,"(descriptor->GetIsAccessor())",
                                    "descriptor->GetIsAccessor()");
        if (!bVar5) goto LAB_00c23897;
        *puVar10 = 0;
      }
      uVar7 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_38);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar7,value);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_38);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,value);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      pcVar9 = JavascriptString::GetString(propertyNameString);
      cVar8 = JavascriptString::GetLength(propertyNameString);
      propertyId = ScriptContext::GetOrAddPropertyIdTracked(this_00,pcVar9,cVar8);
      ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    }
    if ((local_38->Attributes & 0x10) == 0) {
      if ((local_38->flags & IsShadowed) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x3dd,"(!descriptor->GetIsShadowed())",
                                    "!descriptor->GetIsShadowed()");
        if (!bVar5) {
LAB_00c23897:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      local_38->Attributes = '\x0e';
    }
    else {
      local_38->Attributes = local_38->Attributes & 0xf0 | 0xe;
    }
    InvalidateFixedField<Js::JavascriptString*>(this,instance,propertyNameString,local_38);
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,(CharacterBuffer<char16_t> *)local_70,
               (Var)0x0,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty(DynamicObject *instance, JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
        DictionaryPropertyDescriptor<T>* descriptor;
        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString))
            {
                // If you are deleting a valueOf/toString and the flag wasn't set, it means you are deleting the default
                // implementation off of Object.prototype
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, propertyNameString->GetString());

                return false;
            }

            Var undefined = library->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetString(), propertyNameString->GetLength()));
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyNameString, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        return true;
    }